

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O1

void __thiscall cmComputeTargetDepends::CollectSideEffects(cmComputeTargetDepends *this)

{
  int iVar1;
  int depender_index;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_50;
  
  depender_index = 0;
  std::
  vector<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
  ::resize(&this->SideEffects,0);
  std::
  vector<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
  ::resize(&this->SideEffects,
           ((long)(this->InitialGraph).
                  super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                  super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->InitialGraph).
                  super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                  super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  iVar1 = (int)((ulong)((long)(this->InitialGraph).
                              super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                              super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->InitialGraph).
                             super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                             super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  local_50._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_50._M_impl.super__Rb_tree_header._M_header;
  local_50._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_50._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_50._M_impl.super__Rb_tree_header._M_header._M_right =
       local_50._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < iVar1) {
    do {
      CollectSideEffectsForTarget
                (this,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_50,depender_index);
      depender_index = depender_index + 1;
    } while (iVar1 != depender_index);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_50);
  return;
}

Assistant:

void cmComputeTargetDepends::CollectSideEffects()
{
  this->SideEffects.resize(0);
  this->SideEffects.resize(this->InitialGraph.size());

  int n = static_cast<int>(this->InitialGraph.size());
  std::set<int> visited;
  for (int i = 0; i < n; ++i) {
    this->CollectSideEffectsForTarget(visited, i);
  }
}